

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::event_declaration_t::~event_declaration_t(event_declaration_t *this)

{
  ~event_declaration_t(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

event_declaration_t::~event_declaration_t() = default;